

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

int garray_getfloatwords(_garray *x,int *size,t_word **vec)

{
  int iVar1;
  _array *p_Var2;
  t_word *ptVar3;
  char *pcVar4;
  char *fmt;
  int elemsize;
  int yonset;
  
  p_Var2 = garray_getarray_floatonly(x,&yonset,&elemsize);
  if (p_Var2 == (_array *)0x0) {
    pcVar4 = x->x_realname->s_name;
    fmt = "%s: needs floating-point \'y\' field";
  }
  else {
    if (elemsize == 8) {
      iVar1 = garray_npoints(x);
      *size = iVar1;
      ptVar3 = (t_word *)garray_vec(x);
      *vec = ptVar3;
      return 1;
    }
    pcVar4 = x->x_realname->s_name;
    fmt = "%s: has more than one field";
  }
  pd_error((void *)0x0,fmt,pcVar4);
  return 0;
}

Assistant:

int garray_getfloatwords(t_garray *x, int *size, t_word **vec)
{
    int yonset, elemsize;
    t_array *a = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!a)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return (0);
    }
    else if (elemsize != sizeof(t_word))
    {
        pd_error(0, "%s: has more than one field", x->x_realname->s_name);
        return (0);
    }
    *size = garray_npoints(x);
    *vec =  (t_word *)garray_vec(x);
    return (1);
}